

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O2

void __thiscall
ft::multiset<int,_ft::less<int>,_ft::allocator<int>_>::erase
          (multiset<int,_ft::less<int>,_ft::allocator<int>_> *this,iterator *first,iterator *last)

{
  treeNode<int> *ptVar1;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *pRVar2;
  iterator local_48;
  
  while (ptVar1 = first->m_node, ptVar1 != last->m_node) {
    pRVar2 = first->m_tree;
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(first);
    local_48._vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcf0;
    local_48.m_tree = pRVar2;
    local_48.m_node = ptVar1;
    erase(this,&local_48);
  }
  return;
}

Assistant:

void	erase(iterator first, iterator last) {
		while (first != last) {
			iterator	tmp = first;
			++first;
			this->erase(tmp);
		}
	}